

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O2

void __thiscall FIX::SessionSettings::validate(SessionSettings *this,Dictionary *dictionary)

{
  bool bVar1;
  ConfigError *pCVar2;
  allocator<char> local_99;
  string connectionType;
  string local_78;
  string beginString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&connectionType,"BeginString",(allocator<char> *)&local_78);
  Dictionary::getString(&beginString,dictionary,&connectionType,false);
  std::__cxx11::string::~string((string *)&connectionType);
  bVar1 = std::operator!=(&beginString,"FIX.4.0");
  if (bVar1) {
    bVar1 = std::operator!=(&beginString,"FIX.4.1");
    if (bVar1) {
      bVar1 = std::operator!=(&beginString,"FIX.4.2");
      if (bVar1) {
        bVar1 = std::operator!=(&beginString,"FIX.4.3");
        if (bVar1) {
          bVar1 = std::operator!=(&beginString,"FIX.4.4");
          if (bVar1) {
            bVar1 = std::operator!=(&beginString,BeginString_FIXT11);
            if (bVar1) {
              pCVar2 = (ConfigError *)__cxa_allocate_exception(0x50);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_78,"BeginString",(allocator<char> *)&local_38);
              std::operator+(&connectionType,&local_78," must be FIX.4.0 to FIX.4.4 or FIXT.1.1");
              ConfigError::ConfigError(pCVar2,&connectionType);
              __cxa_throw(pCVar2,&ConfigError::typeinfo,Exception::~Exception);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ConnectionType",(allocator<char> *)&local_38);
  Dictionary::getString(&connectionType,dictionary,&local_78,false);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = std::operator!=(&connectionType,"initiator");
  if (bVar1) {
    bVar1 = std::operator!=(&connectionType,"acceptor");
    if (bVar1) {
      pCVar2 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"ConnectionType",&local_99);
      std::operator+(&local_78,&local_38," must be \'initiator\' or \'acceptor\'");
      ConfigError::ConfigError(pCVar2,&local_78);
      __cxa_throw(pCVar2,&ConfigError::typeinfo,Exception::~Exception);
    }
  }
  std::__cxx11::string::~string((string *)&connectionType);
  std::__cxx11::string::~string((string *)&beginString);
  return;
}

Assistant:

EXCEPT(ConfigError) {
  std::string beginString = dictionary.getString(BEGINSTRING);
  if (beginString != BeginString_FIX40 && beginString != BeginString_FIX41 && beginString != BeginString_FIX42
      && beginString != BeginString_FIX43 && beginString != BeginString_FIX44 && beginString != BeginString_FIXT11) {
    throw ConfigError(std::string(BEGINSTRING) + " must be FIX.4.0 to FIX.4.4 or FIXT.1.1");
  }

  std::string connectionType = dictionary.getString(CONNECTION_TYPE);
  if (connectionType != "initiator" && connectionType != "acceptor") {
    throw ConfigError(std::string(CONNECTION_TYPE) + " must be 'initiator' or 'acceptor'");
  }
}